

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshglob.c
# Opt level: O2

void psh_blues_set_zones(PSH_Blues target,FT_UInt count,FT_Short *blues,FT_UInt count_others,
                        FT_Short *other_blues,FT_Int fuzz,FT_Int family)

{
  FT_UInt FVar1;
  PSH_Blues top_table;
  int iVar2;
  int iVar3;
  PSH_Blue_ZoneRec *pPVar4;
  FT_UInt FVar5;
  FT_UInt FVar6;
  int iVar7;
  int iVar8;
  FT_Int FVar9;
  undefined4 in_register_0000008c;
  PSH_Blue_Table bot_table;
  FT_Int dim;
  int iVar10;
  PSH_Blues read;
  FT_Int *pFVar11;
  
  bot_table = (PSH_Blue_Table)CONCAT44(in_register_0000008c,fuzz);
  read = (PSH_Blues)&target->family_top;
  top_table = (PSH_Blues)&target->family_bottom;
  if (family == 0) {
    read = target;
    top_table = (PSH_Blues)&target->normal_bottom;
  }
  (read->normal_top).count = 0;
  (top_table->normal_top).count = 0;
  psh_blues_set_zones_0
            ((PSH_Blues)0x0,(FT_Bool)count,(FT_UInt)blues,(FT_Short *)read,&top_table->normal_top,
             bot_table);
  iVar10 = 1;
  psh_blues_set_zones_0
            ((PSH_Blues)0x1,(FT_Bool)count_others,(FT_UInt)other_blues,(FT_Short *)read,
             &top_table->normal_top,bot_table);
  FVar6 = (read->normal_top).count;
  FVar1 = (top_table->normal_top).count;
  if (FVar6 != 0) {
    pPVar4 = (read->normal_top).zones;
    FVar5 = FVar6;
    do {
      if (FVar5 == 1) {
        iVar7 = pPVar4->org_ref;
        FVar9 = pPVar4->org_delta;
      }
      else {
        if (FVar5 == 0) break;
        iVar7 = pPVar4->org_ref;
        FVar9 = pPVar4->org_delta;
        iVar8 = pPVar4[1].org_ref - iVar7;
        if (iVar8 < FVar9) {
          pPVar4->org_delta = iVar8;
          FVar9 = iVar8;
        }
      }
      pPVar4->org_bottom = iVar7;
      pPVar4->org_top = FVar9 + iVar7;
      FVar5 = FVar5 - 1;
      pPVar4 = pPVar4 + 1;
    } while( true );
  }
  if (FVar1 != 0) {
    pPVar4 = (top_table->normal_top).zones;
    FVar5 = FVar1;
    do {
      if (FVar5 == 1) {
        iVar7 = pPVar4->org_ref;
        FVar9 = pPVar4->org_delta;
      }
      else {
        if (FVar5 == 0) break;
        iVar7 = pPVar4->org_ref;
        FVar9 = pPVar4->org_delta;
        iVar8 = iVar7 - pPVar4[1].org_ref;
        if (FVar9 < iVar8) {
          pPVar4->org_delta = iVar8;
          FVar9 = iVar8;
        }
      }
      pPVar4->org_top = iVar7;
      pPVar4->org_bottom = FVar9 + iVar7;
      FVar5 = FVar5 - 1;
      pPVar4 = pPVar4 + 1;
    } while( true );
  }
  for (; -1 < iVar10; iVar10 = iVar10 + -1) {
    if (FVar6 != 0) {
      pFVar11 = &(read->normal_top).zones[0].org_bottom;
      *pFVar11 = *pFVar11 - fuzz;
      pFVar11 = &(read->normal_top).zones[0].org_top;
      while( true ) {
        FVar6 = FVar6 - 1;
        iVar7 = *pFVar11;
        if (FVar6 == 0) break;
        iVar3 = (pFVar11[0xd] - iVar7) / 2;
        iVar8 = iVar3 + iVar7;
        iVar7 = iVar7 + fuzz;
        iVar2 = pFVar11[0xd] - fuzz;
        if (iVar3 < fuzz) {
          iVar7 = iVar8;
          iVar2 = iVar8;
        }
        pFVar11[0xd] = iVar2;
        *pFVar11 = iVar7;
        pFVar11 = pFVar11 + 0xc;
      }
      *pFVar11 = iVar7 + fuzz;
    }
    read = top_table;
    FVar6 = FVar1;
  }
  return;
}

Assistant:

static void
  psh_blues_set_zones( PSH_Blues  target,
                       FT_UInt    count,
                       FT_Short*  blues,
                       FT_UInt    count_others,
                       FT_Short*  other_blues,
                       FT_Int     fuzz,
                       FT_Int     family )
  {
    PSH_Blue_Table  top_table, bot_table;
    FT_UInt         count_top, count_bot;


    if ( family )
    {
      top_table = &target->family_top;
      bot_table = &target->family_bottom;
    }
    else
    {
      top_table = &target->normal_top;
      bot_table = &target->normal_bottom;
    }

    /* read the input blue zones, and build two sorted tables  */
    /* (one for the top zones, the other for the bottom zones) */
    top_table->count = 0;
    bot_table->count = 0;

    /* first, the blues */
    psh_blues_set_zones_0( target, 0,
                           count, blues, top_table, bot_table );
    psh_blues_set_zones_0( target, 1,
                           count_others, other_blues, top_table, bot_table );

    count_top = top_table->count;
    count_bot = bot_table->count;

    /* sanitize top table */
    if ( count_top > 0 )
    {
      PSH_Blue_Zone  zone = top_table->zones;


      for ( count = count_top; count > 0; count--, zone++ )
      {
        FT_Int  delta;


        if ( count > 1 )
        {
          delta = zone[1].org_ref - zone[0].org_ref;
          if ( zone->org_delta > delta )
            zone->org_delta = delta;
        }

        zone->org_bottom = zone->org_ref;
        zone->org_top    = zone->org_delta + zone->org_ref;
      }
    }

    /* sanitize bottom table */
    if ( count_bot > 0 )
    {
      PSH_Blue_Zone  zone = bot_table->zones;


      for ( count = count_bot; count > 0; count--, zone++ )
      {
        FT_Int  delta;


        if ( count > 1 )
        {
          delta = zone[0].org_ref - zone[1].org_ref;
          if ( zone->org_delta < delta )
            zone->org_delta = delta;
        }

        zone->org_top    = zone->org_ref;
        zone->org_bottom = zone->org_delta + zone->org_ref;
      }
    }

    /* expand top and bottom tables with blue fuzz */
    {
      FT_Int         dim, top, bot, delta;
      PSH_Blue_Zone  zone;


      zone  = top_table->zones;
      count = count_top;

      for ( dim = 1; dim >= 0; dim-- )
      {
        if ( count > 0 )
        {
          /* expand the bottom of the lowest zone normally */
          zone->org_bottom -= fuzz;

          /* expand the top and bottom of intermediate zones;    */
          /* checking that the interval is smaller than the fuzz */
          top = zone->org_top;

          for ( count--; count > 0; count-- )
          {
            bot   = zone[1].org_bottom;
            delta = bot - top;

            if ( delta / 2 < fuzz )
              zone[0].org_top = zone[1].org_bottom = top + delta / 2;
            else
            {
              zone[0].org_top    = top + fuzz;
              zone[1].org_bottom = bot - fuzz;
            }

            zone++;
            top = zone->org_top;
          }

          /* expand the top of the highest zone normally */
          zone->org_top = top + fuzz;
        }
        zone  = bot_table->zones;
        count = count_bot;
      }
    }
  }